

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlStringLenGetNodeList(xmlDoc *doc,xmlChar *value,int len)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  xmlBufPtr buf;
  xmlChar *pxVar5;
  xmlEntityPtr pxVar6;
  xmlChar *pxVar7;
  xmlNodePtr pxVar8;
  xmlNodePtr elem;
  _xmlNode *p_Var9;
  long lVar10;
  int code;
  byte *pbVar11;
  byte *pbVar12;
  byte *cur;
  byte *pbVar13;
  bool bVar14;
  xmlNodePtr local_60;
  xmlNodePtr local_50;
  xmlChar buffer [10];
  
  if ((value == (xmlChar *)0x0) || (buf = xmlBufCreateSize(0), buf == (xmlBufPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  pbVar13 = value + len;
  local_50 = (xmlNodePtr)0x0;
  xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
  elem = (xmlNodePtr)0x0;
  pbVar11 = value;
  pbVar12 = value;
LAB_0017e1c0:
  while( true ) {
    pbVar11 = pbVar11 + 1;
    local_60 = elem;
    if ((pbVar13 <= value) || (*value == 0)) break;
    if (*value == 0x26) {
      if ((value != pbVar12) &&
         (iVar3 = xmlBufAdd(buf,pbVar12,(int)value - (int)pbVar12), iVar3 != 0)) goto LAB_0017e53f;
      pbVar12 = value + 2;
      if ((pbVar12 < pbVar13) && ((value[1] == 0x23 && (*pbVar12 == 0x78)))) {
        pbVar12 = value + 3;
        iVar3 = 0;
        do {
          uVar4 = 0;
          if (pbVar12 < pbVar13) {
            uVar4 = (uint)*pbVar12;
          }
          cVar2 = (char)uVar4;
          bVar14 = cVar2 == ';';
          if (bVar14) goto LAB_0017e29c;
          if ((byte)(cVar2 - 0x30U) < 10) {
            iVar3 = iVar3 * 0x10 + uVar4 + -0x30;
          }
          else if ((byte)(cVar2 + 0x9fU) < 6) {
            iVar3 = iVar3 * 0x10 + uVar4 + -0x57;
          }
          else {
            if (5 < (byte)(cVar2 + 0xbfU)) goto LAB_0017e339;
            iVar3 = iVar3 * 0x10 + uVar4 + -0x37;
          }
          pbVar12 = pbVar12 + 1;
        } while( true );
      }
      cur = value + 1;
      if ((cur < pbVar13) && (*cur == 0x23)) {
        iVar3 = 0;
        while( true ) {
          bVar1 = 0;
          if (pbVar12 < pbVar13) {
            bVar1 = *pbVar12;
          }
          bVar14 = bVar1 == 0x3b;
          if (bVar14) goto LAB_0017e29c;
          if (9 < (byte)(bVar1 - 0x30)) break;
          iVar3 = iVar3 * 10 + (uint)bVar1 + -0x30;
          pbVar12 = pbVar12 + 1;
        }
        code = 0x515;
        goto LAB_0017e28e;
      }
      lVar10 = 1;
      while( true ) {
        if ((pbVar13 <= pbVar11) || (*pbVar11 == 0)) {
          xmlTreeErr(0x516,(xmlNodePtr)doc,(char *)cur);
          goto LAB_0017e53f;
        }
        if (*pbVar11 == 0x3b) break;
        lVar10 = lVar10 + 1;
        pbVar11 = pbVar11 + 1;
      }
      if (lVar10 != 1) {
        pxVar5 = xmlStrndup(cur,(int)lVar10 + -1);
        pxVar6 = xmlGetDocEntity(doc,pxVar5);
        if ((pxVar6 == (xmlEntityPtr)0x0) || (pxVar6->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
          iVar3 = xmlBufIsEmpty(buf);
          pxVar8 = local_50;
          if (iVar3 == 0) {
            local_60 = xmlNewDocText(doc,(xmlChar *)0x0);
            pxVar8 = elem;
            if (local_60 != (xmlNodePtr)0x0) {
              pxVar7 = xmlBufDetach(buf);
              local_60->content = pxVar7;
              pxVar8 = local_60;
              if (local_50 != (xmlNodePtr)0x0) {
                pxVar8 = xmlAddNextSibling(local_50,local_60);
                local_60 = elem;
              }
              goto LAB_0017e41d;
            }
          }
          else {
LAB_0017e41d:
            local_50 = pxVar8;
            elem = xmlNewReference(doc,pxVar5);
            pxVar8 = local_60;
            if (elem != (xmlNodePtr)0x0) {
              if ((pxVar6 != (xmlEntityPtr)0x0) && (pxVar6->children == (_xmlNode *)0x0)) {
                pxVar6->children = (_xmlNode *)0xffffffffffffffff;
                p_Var9 = xmlStringGetNodeList(doc,elem->content);
                pxVar6->children = p_Var9;
                pxVar6->owner = 1;
                for (; p_Var9 != (_xmlNode *)0x0; p_Var9 = p_Var9->next) {
                  p_Var9->parent = (_xmlNode *)pxVar6;
                  pxVar6->last = p_Var9;
                }
              }
              pxVar8 = elem;
              if (local_50 != (xmlNodePtr)0x0) {
                pxVar8 = xmlAddNextSibling(local_50,elem);
                elem = local_60;
              }
              goto LAB_0017e465;
            }
          }
          local_60 = pxVar8;
          if (pxVar5 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar5);
          }
          goto LAB_0017e53f;
        }
        iVar3 = xmlBufCat(buf,pxVar6->content);
        pxVar8 = local_50;
        if (iVar3 != 0) goto LAB_0017e53f;
LAB_0017e465:
        local_50 = pxVar8;
        (*xmlFree)(pxVar5);
      }
      value = pbVar11 + 1;
      pbVar11 = value;
      pbVar12 = value;
    }
    else {
      value = value + 1;
    }
  }
  if ((value == pbVar12) || (iVar3 = xmlBufAdd(buf,pbVar12,(int)value - (int)pbVar12), iVar3 == 0))
  {
    iVar3 = xmlBufIsEmpty(buf);
    if (iVar3 == 0) {
      pxVar8 = xmlNewDocText(doc,(xmlChar *)0x0);
      if (pxVar8 != (xmlNodePtr)0x0) {
        pxVar5 = xmlBufDetach(buf);
        pxVar8->content = pxVar5;
        local_60 = pxVar8;
        if (local_50 != (xmlNodePtr)0x0) {
          xmlAddNextSibling(local_50,pxVar8);
          local_60 = elem;
        }
      }
    }
    else if (elem == (xmlNodePtr)0x0) {
      local_60 = xmlNewDocText(doc,"");
    }
  }
  goto LAB_0017e53f;
LAB_0017e339:
  code = 0x514;
LAB_0017e28e:
  iVar3 = 0;
  xmlTreeErr(code,(xmlNodePtr)doc,(char *)0x0);
LAB_0017e29c:
  value = pbVar12 + bVar14;
  pbVar11 = value;
  pbVar12 = value;
  if (iVar3 != 0) {
    iVar3 = xmlCopyCharMultiByte(buffer,iVar3);
    buffer[iVar3] = '\0';
    iVar3 = xmlBufCat(buf,buffer);
    if (iVar3 != 0) {
LAB_0017e53f:
      xmlBufFree(buf);
      return local_60;
    }
  }
  goto LAB_0017e1c0;
}

Assistant:

xmlNodePtr
xmlStringLenGetNodeList(const xmlDoc *doc, const xmlChar *value, int len) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur, *end;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);
    cur = value;
    end = cur + len;

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while ((cur < end) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur + 2 < end) && (cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loop */
                    /*
                     * If you find an integer overflow here when fuzzing,
                     * the bug is probably elsewhere. This function should
                     * only receive entities that were already validated by
                     * the parser, typically by xmlParseAttValueComplex
                     * calling xmlStringDecodeEntities.
                     *
                     * So it's better *not* to check for overflow to
                     * potentially discover new bugs.
                     */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if ((cur + 1 < end) && (cur[1] == '#')) {
		cur += 2;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((cur < end) && (*cur != 0) && (*cur != ';')) cur++;
		if ((cur >= end) || (*cur == 0)) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY, (xmlNodePtr) doc,
		               (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL) {
				if (val != NULL) xmlFree(val);
				goto out;
			    }
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL) goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    } else if (ret == NULL) {
        ret = xmlNewDocText(doc, BAD_CAST "");
    }

out:
    xmlBufFree(buf);
    return(ret);
}